

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
ChebTools::ChebyshevExpansion::real_roots
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,ChebyshevExpansion *this,
          bool only_in_domain)

{
  Index IVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  bool local_119;
  double local_a0;
  double x_1;
  double dStack_90;
  bool is_in_domain_1;
  double val_n11_1;
  Index i;
  undefined1 local_68 [8];
  VectorXcd eigs;
  double x;
  bool is_in_domain;
  double val_n11;
  undefined1 local_30 [8];
  VectorXd new_mc;
  bool only_in_domain_local;
  ChebyshevExpansion *this_local;
  vector<double,_std::allocator<double>_> *roots;
  
  new_mc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._6_1_ = 0;
  new_mc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._7_1_ =
       only_in_domain;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  reduce_zeros((ChebyshevExpansion *)local_30,&this->m_c);
  IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_30);
  if (1 < IVar1) {
    IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_30);
    if (IVar1 == 2) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_30,0);
      dVar4 = *pSVar2;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_30,1);
      dVar4 = -dVar4 / *pSVar2;
      if (((new_mc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
            _7_1_ & 1) == 0) || (-1.0 <= dVar4 && dVar4 <= 1.0)) {
        eigs.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows = (Index)(((this->m_xmax - this->m_xmin) * dVar4 + this->m_xmax + this->m_xmin) * 0.5
                        );
        std::vector<double,_std::allocator<double>_>::push_back
                  (__return_storage_ptr__,
                   (value_type_conflict *)
                   &eigs.
                    super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows);
      }
    }
    else {
      companion_matrix((MatrixXd *)&i,this,(VectorXd *)local_30);
      eigenvalues((ChebTools *)local_68,(MatrixXd *)&i,true);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)&i);
      for (val_n11_1 = 0.0; dVar4 = val_n11_1,
          IVar1 = Eigen::EigenBase<Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>_>::size
                            ((EigenBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *)
                             local_68), (long)dVar4 < IVar1;
          val_n11_1 = (double)((long)val_n11_1 + 1)) {
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>,_1>::
                 operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>,_1>
                             *)local_68,(Index)val_n11_1);
        std::complex<double>::imag_abi_cxx11_(pSVar3);
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>,_1>::
                 operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>,_1>
                             *)local_68,(Index)val_n11_1);
        std::complex<double>::real_abi_cxx11_(pSVar3);
        std::abs((int)pSVar3);
        if (extraout_XMM0_Qa < 1e-15) {
          pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>,_1>::
                   operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>,_1>
                               *)local_68,(Index)val_n11_1);
          dStack_90 = std::complex<double>::real_abi_cxx11_(pSVar3);
          local_119 = -1.0 <= dStack_90 && dStack_90 <= 1.0;
          x_1._7_1_ = local_119;
          if (((new_mc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows._7_1_ & 1) == 0) || (-1.0 <= dStack_90 && dStack_90 <= 1.0)) {
            local_a0 = ((this->m_xmax - this->m_xmin) * dStack_90 + this->m_xmax + this->m_xmin) *
                       0.5;
            std::vector<double,_std::allocator<double>_>::push_back
                      (__return_storage_ptr__,&local_a0);
          }
        }
      }
      Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<std::complex<double>,__1,_1,_0,__1,_1> *)local_68);
    }
  }
  new_mc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._6_1_ = 1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_30);
  if ((new_mc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._6_1_
      & 1) == 0) {
    std::vector<double,_std::allocator<double>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> ChebyshevExpansion::real_roots(bool only_in_domain) const {
      //vector of roots to be returned
        std::vector<double> roots;
        Eigen::VectorXd new_mc = reduce_zeros(m_c);
        //if the Chebyshev polynomial is just a constant, then there are no roots
        //if a_0=0 then there are infinite roots, but for our purposes, infinite roots doesnt make sense
        if (new_mc.size()<=1){ //we choose <=1 to account for the case of no coefficients
          return roots; //roots is empty
        }

        //if the Chebyshev polynomial is linear, then the only possible root is -a_0/a_1
        //we have this else if block because eigen is not a fan of 1x1 matrices
        else if (new_mc.size()==2){
          double val_n11 = -new_mc(0)/new_mc(1);
          const bool is_in_domain = (val_n11 >= -1.0 && val_n11 <= 1.0);
          // Keep it if it is in domain, or if you just want all real roots
          if (!only_in_domain || is_in_domain) {
              // Rescale back into real-world values in [xmin,xmax] from [-1,1]
              double x = ((m_xmax - m_xmin)*val_n11 + (m_xmax + m_xmin)) / 2.0;
              roots.push_back(x);
          }
        }

        //this for all cases of higher order polynomials
        else{
          // The companion matrix is definitely lower Hessenberg, so we can skip the Hessenberg
          // decomposition, and get the real eigenvalues directly.  These eigenvalues are defined
          // in the domain [-1, 1], but it might also include values outside [-1, 1]
          Eigen::VectorXcd eigs = eigenvalues(companion_matrix(new_mc), /* balance = */ true);


          for (Eigen::Index i = 0; i < eigs.size(); ++i) {
              if (std::abs(eigs(i).imag() / eigs(i).real()) < 1e-15) {
                  double val_n11 = eigs(i).real();
                  const bool is_in_domain = (val_n11 >= -1.0 && val_n11 <= 1.0);
                  // Keep it if it is in domain, or if you just want all real roots
                  if (!only_in_domain || is_in_domain) {
                      // Rescale back into real-world values in [xmin,xmax] from [-1,1]
                      double x = ((m_xmax - m_xmin)*val_n11 + (m_xmax + m_xmin)) / 2.0;
                      roots.push_back(x);
                  }
              }
          }
        }
        return roots;
    
    //// The companion matrix is definitely lower Hessenberg, so we can skip the Hessenberg
    //// decomposition, and get the real eigenvalues directly.  These eigenvalues are defined
    //// in the domain [-1, 1], but it might also include values outside [-1, 1]
    //Eigen::VectorXd real_eigs = eigenvalues_upperHessenberg(companion_matrix().transpose(), /* balance = */ true);
    //
    //std::vector<double> roots;
    //for (Eigen::Index i = 0; i < real_eigs.size(); ++i){
    //    double val_n11 = real_eigs(i);
    //    const bool is_in_domain = (val_n11 >= -1.0 && val_n11 <= 1.0);
    //    // Keep it if it is in domain, or if you just want all real roots
    //    if (!only_in_domain || is_in_domain){
    //        // Rescale back into real-world values in [xmin,xmax] from [-1,1]
    //        double x = ((m_xmax - m_xmin)*val_n11 + (m_xmax + m_xmin)) / 2.0;
    //        roots.push_back(x);
    //    }
    //}
    //return roots;
    }